

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cc
# Opt level: O3

void make_write_cache(vw *all,string *newname,bool quiet)

{
  io_buf *piVar1;
  char cVar2;
  uint uVar3;
  long *plVar4;
  ostream *poVar5;
  long *plVar6;
  vw_ostream *pvVar7;
  string temp;
  size_t v_length;
  string local_78;
  long *local_58;
  long local_50;
  long local_48;
  long lStack_40;
  long local_38;
  
  piVar1 = all->p->output;
  if ((piVar1->files)._end != (piVar1->files)._begin) {
    std::__ostream_insert<char,std::char_traits<char>>
              (&(all->trace_message).super_ostream,
               "Warning: you tried to make two write caches.  Only the first one will be made.",0x4e
              );
    cVar2 = (char)&all->trace_message;
    std::ios::widen((char)(all->trace_message).super_ostream._vptr_basic_ostream[-3] + cVar2);
    std::ostream::put(cVar2);
    std::ostream::flush();
    return;
  }
  local_78._M_dataplus._M_p = (pointer)&local_78.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_78,".writing","");
  plVar4 = (long *)std::__cxx11::string::replace
                             ((ulong)&local_78,0,(char *)0x0,(ulong)(newname->_M_dataplus)._M_p);
  local_58 = &local_48;
  plVar6 = plVar4 + 2;
  if ((long *)*plVar4 == plVar6) {
    local_48 = *plVar6;
    lStack_40 = plVar4[3];
  }
  else {
    local_48 = *plVar6;
    local_58 = (long *)*plVar4;
  }
  local_50 = plVar4[1];
  *plVar4 = (long)plVar6;
  plVar4[1] = 0;
  *(undefined1 *)(plVar4 + 2) = 0;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_78._M_dataplus._M_p != &local_78.field_2) {
    operator_delete(local_78._M_dataplus._M_p);
  }
  push_many<char>(&piVar1->currentname,(char *)local_58,local_50 + 1);
  uVar3 = (**piVar1->_vptr_io_buf)(piVar1,local_58,(ulong)all->stdin_off,2);
  if (uVar3 == 0xffffffff) {
    pvVar7 = &all->trace_message;
    std::__ostream_insert<char,std::char_traits<char>>
              (&pvVar7->super_ostream,"can\'t create cache file !",0x19);
    std::ios::widen((char)(pvVar7->super_ostream)._vptr_basic_ostream[-3] + (char)pvVar7);
    std::ostream::put((char)pvVar7);
    std::ostream::flush();
  }
  else {
    version_struct::to_string_abi_cxx11_(&local_78,&version);
    local_38 = local_78._M_string_length + 1;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_78._M_dataplus._M_p != &local_78.field_2) {
      operator_delete(local_78._M_dataplus._M_p);
    }
    (*piVar1->_vptr_io_buf[6])(piVar1,(ulong)uVar3,&local_38,8);
    version_struct::to_string_abi_cxx11_(&local_78,&version);
    (*piVar1->_vptr_io_buf[6])(piVar1,(ulong)uVar3,local_78._M_dataplus._M_p,local_38);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_78._M_dataplus._M_p != &local_78.field_2) {
      operator_delete(local_78._M_dataplus._M_p);
    }
    (*piVar1->_vptr_io_buf[6])(piVar1,(ulong)uVar3,"c",1);
    (*piVar1->_vptr_io_buf[6])(piVar1,(ulong)uVar3,&all->num_bits,4);
    push_many<char>(&piVar1->finalname,(newname->_M_dataplus)._M_p,newname->_M_string_length + 1);
    all->p->write_cache = true;
    if (!quiet) {
      std::__ostream_insert<char,std::char_traits<char>>
                (&(all->trace_message).super_ostream,"creating cache_file = ",0x16);
      poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                         (&(all->trace_message).super_ostream,(newname->_M_dataplus)._M_p,
                          newname->_M_string_length);
      std::ios::widen((char)poVar5->_vptr_basic_ostream[-3] + (char)poVar5);
      std::ostream::put((char)poVar5);
      std::ostream::flush();
    }
  }
  if (local_58 != &local_48) {
    operator_delete(local_58);
  }
  return;
}

Assistant:

void make_write_cache(vw& all, string& newname, bool quiet)
{
  io_buf* output = all.p->output;
  if (output->files.size() != 0)
  {
    all.trace_message << "Warning: you tried to make two write caches.  Only the first one will be made." << endl;
    return;
  }

  string temp = newname + string(".writing");
  push_many(output->currentname, temp.c_str(), temp.length() + 1);

  int f = output->open_file(temp.c_str(), all.stdin_off, io_buf::WRITE);
  if (f == -1)
  {
    all.trace_message << "can't create cache file !" << endl;
    return;
  }

  size_t v_length = (uint64_t)version.to_string().length() + 1;

  output->write_file(f, &v_length, sizeof(v_length));
  output->write_file(f, version.to_string().c_str(), v_length);
  output->write_file(f, "c", 1);
  output->write_file(f, &all.num_bits, sizeof(all.num_bits));

  push_many(output->finalname, newname.c_str(), newname.length() + 1);
  all.p->write_cache = true;
  if (!quiet)
    all.trace_message << "creating cache_file = " << newname << endl;
}